

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_combo_begin_image_text(nk_context *ctx,char *selected,int len,nk_image img,nk_vec2 size)

{
  long lVar1;
  nk_rect r;
  nk_rect r_00;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect r_01;
  nk_rect header_00;
  nk_rect b;
  nk_vec2 size_00;
  nk_widget_layout_states nVar2;
  nk_bool nVar3;
  uint uVar4;
  nk_flags *in_RDI;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float a;
  float fVar12;
  float fVar13;
  float fVar14;
  nk_symbol_type sym;
  int draw_button_symbol;
  nk_rect image;
  nk_rect label;
  nk_rect button;
  nk_rect content;
  nk_text text;
  nk_style_item *background;
  nk_widget_layout_states s;
  int is_clicked;
  nk_rect header;
  nk_input *in;
  nk_style *style;
  nk_window *win;
  undefined8 in_stack_ffffffffffffff18;
  nk_input *in_stack_ffffffffffffff20;
  nk_flags *state;
  nk_symbol_type type;
  nk_style_button *style_00;
  undefined4 in_stack_ffffffffffffff38;
  nk_flags in_stack_ffffffffffffff3c;
  float in_stack_ffffffffffffff40;
  nk_color in_stack_ffffffffffffff44;
  nk_color col;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  float fVar15;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  float fVar16;
  nk_flags *local_60;
  float local_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  nk_bool local_4;
  
  style_00 = (nk_style_button *)&stack0x00000008;
  if (((in_RDI == (nk_flags *)0x0) || (*(long *)(in_RDI + 0x1036) == 0)) ||
     (*(long *)(*(long *)(in_RDI + 0x1036) + 0xa8) == 0)) {
    local_4 = 0;
  }
  else {
    lVar1 = *(long *)(in_RDI + 0x1036);
    nVar2 = nk_widget((nk_rect *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                      (nk_context *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    if (nVar2 == NK_WIDGET_INVALID) {
      local_4 = 0;
    }
    else {
      if (((*(uint *)(*(long *)(lVar1 + 0xa8) + 4) & 0x1000) != 0) ||
         (state = in_RDI, nVar2 == NK_WIDGET_ROM)) {
        state = (nk_flags *)0x0;
      }
      r.y = (float)in_stack_ffffffffffffff38;
      r.x = (float)(int)((ulong)style_00 >> 0x20);
      r.w = (float)in_stack_ffffffffffffff3c;
      r.h = in_stack_ffffffffffffff40;
      nVar3 = nk_button_behavior(state,r,in_stack_ffffffffffffff20,
                                 (nk_button_behavior)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      type = (nk_symbol_type)((ulong)state >> 0x20);
      if ((in_RDI[0x7dc] & 0x20) == 0) {
        if ((in_RDI[0x7dc] & 0x10) == 0) {
          local_60 = in_RDI + 0x6ac;
        }
        else {
          local_60 = in_RDI + 0x6b4;
        }
      }
      else {
        local_60 = in_RDI + 0x6bc;
      }
      if (*local_60 == 1) {
        nk_rgba(0,0,0,0);
        r_00.y = (float)in_stack_ffffffffffffff4c;
        r_00.x = (float)in_stack_ffffffffffffff48;
        r_00.w = (float)in_stack_ffffffffffffff50;
        r_00.h = in_stack_ffffffffffffff54;
        nk_draw_image((nk_command_buffer *)
                      CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),r_00,
                      (nk_image *)style_00,in_stack_ffffffffffffff44);
      }
      else {
        rect.y = (float)in_stack_ffffffffffffff4c;
        rect.x = (float)in_stack_ffffffffffffff48;
        rect.w = (float)in_stack_ffffffffffffff50;
        rect.h = in_stack_ffffffffffffff54;
        nk_fill_rect((nk_command_buffer *)
                     CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),rect,
                     (float)((ulong)style_00 >> 0x20),in_stack_ffffffffffffff44);
        rect_00.y = (float)in_stack_ffffffffffffff4c;
        rect_00.x = (float)in_stack_ffffffffffffff48;
        rect_00.w = (float)in_stack_ffffffffffffff50;
        rect_00.h = in_stack_ffffffffffffff54;
        nk_stroke_rect((nk_command_buffer *)
                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),rect_00,
                       (float)((ulong)style_00 >> 0x20),SUB84(style_00,0),in_stack_ffffffffffffff44)
        ;
      }
      if ((in_RDI[0x7dc] & 0x10) == 0) {
        if (nVar3 == 0) {
          col = *(nk_color *)(in_RDI + 0x6f8);
        }
        else {
          col = *(nk_color *)(in_RDI + 0x6fa);
        }
      }
      else {
        col = *(nk_color *)(in_RDI + 0x6f9);
      }
      uVar4 = (uint)(col != (nk_color)0x0);
      fVar5 = fStack_44 - ((float)in_RDI[0x700] + (float)in_RDI[0x700]);
      fVar6 = ((local_50 + local_48) - fStack_44) - (float)in_RDI[0x6ff];
      fVar7 = fStack_4c + (float)in_RDI[0x700];
      fVar8 = fVar6 + (float)in_RDI[0x6ec];
      fVar9 = fVar7 + (float)in_RDI[0x6ed];
      fVar10 = fVar5 - ((float)in_RDI[0x6ec] + (float)in_RDI[0x6ec]);
      fVar16 = fVar5;
      if (uVar4 != 0) {
        nk_draw_button_symbol
                  ((nk_command_buffer *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   (nk_rect *)CONCAT44(in_stack_ffffffffffffff4c,uVar4),
                   (nk_rect *)CONCAT44(col,in_stack_ffffffffffffff40),in_stack_ffffffffffffff3c,
                   style_00,type,
                   (nk_user_font *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      }
      fVar11 = local_50 + (float)in_RDI[0x6fd];
      a = fStack_44 - ((float)in_RDI[0x6fe] + (float)in_RDI[0x6fe]);
      r_01.y = fVar11;
      r_01.x = (float)uVar4;
      r_01.w = fStack_4c + (float)in_RDI[0x6fe];
      r_01.h = a;
      fVar15 = a;
      nk_draw_image((nk_command_buffer *)
                    CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),r_01,
                    (nk_image *)style_00,col);
      nk_vec2(0.0,0.0);
      fVar12 = fVar11 + a + (float)in_RDI[0x701] + (float)in_RDI[0x6fd];
      fVar13 = fStack_4c + (float)in_RDI[0x6fe];
      if (uVar4 == 0) {
        fVar14 = (local_50 + local_48) - (float)in_RDI[0x6fd];
      }
      else {
        fVar14 = fVar6 - (float)in_RDI[0x6fd];
      }
      fVar14 = fVar14 - fVar12;
      b.y = fVar8;
      b.x = fVar16;
      b.w = fVar9;
      b.h = fVar10;
      nk_widget_text((nk_command_buffer *)CONCAT44(fVar5,fVar7),b,
                     (char *)CONCAT44(fVar6,fStack_44 -
                                            ((float)in_RDI[0x6fe] + (float)in_RDI[0x6fe])),
                     (int)fVar14,(nk_text *)CONCAT44(fVar12,fVar15),(nk_flags)a,
                     (nk_user_font *)CONCAT44(fVar11,uVar4));
      size_00.y = fVar9;
      size_00.x = fVar8;
      header_00.y = fVar7;
      header_00.x = fVar6;
      header_00.w = fVar5;
      header_00.h = fVar16;
      local_4 = nk_combo_begin((nk_context *)CONCAT44(fVar14,fVar13),
                               (nk_window *)CONCAT44(fVar12,fVar15),size_00,(nk_bool)a,header_00);
    }
  }
  return local_4;
}

Assistant:

NK_API nk_bool
nk_combo_begin_image_text(struct nk_context *ctx, const char *selected, int len,
struct nk_image img, struct nk_vec2 size)
{
struct nk_window *win;
struct nk_style *style;
struct nk_input *in;

struct nk_rect header;
int is_clicked = nk_false;
enum nk_widget_layout_states s;
const struct nk_style_item *background;
struct nk_text text;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
style = &ctx->style;
s = nk_widget(&header, ctx);
if (!s) return 0;

in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
is_clicked = nk_true;

/* draw combo box header background and border */
if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED) {
background = &style->combo.active;
text.text = style->combo.label_active;
} else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER) {
background = &style->combo.hover;
text.text = style->combo.label_hover;
} else {
background = &style->combo.normal;
text.text = style->combo.label_normal;
}
if (background->type == NK_STYLE_ITEM_IMAGE) {
text.background = nk_rgba(0,0,0,0);
nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
} else {
text.background = background->data.color;
nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
}
{
struct nk_rect content;
struct nk_rect button;
struct nk_rect label;
struct nk_rect image;
int draw_button_symbol;

enum nk_symbol_type sym;
if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
sym = style->combo.sym_hover;
else if (is_clicked)
sym = style->combo.sym_active;
else sym = style->combo.sym_normal;

/* represents whether or not the combo's button symbol should be drawn */
draw_button_symbol = sym != NK_SYMBOL_NONE;

/* calculate button */
button.w = header.h - 2 * style->combo.button_padding.y;
button.x = (header.x + header.w - header.h) - style->combo.button_padding.x;
button.y = header.y + style->combo.button_padding.y;
button.h = button.w;

content.x = button.x + style->combo.button.padding.x;
content.y = button.y + style->combo.button.padding.y;
content.w = button.w - 2 * style->combo.button.padding.x;
content.h = button.h - 2 * style->combo.button.padding.y;
if (draw_button_symbol)
nk_draw_button_symbol(&win->buffer, &button, &content, ctx->last_widget_state,
&ctx->style.combo.button, sym, style->font);

/* draw image */
image.x = header.x + style->combo.content_padding.x;
image.y = header.y + style->combo.content_padding.y;
image.h = header.h - 2 * style->combo.content_padding.y;
image.w = image.h;
nk_draw_image(&win->buffer, image, &img, nk_white);

/* draw label */
text.padding = nk_vec2(0,0);
label.x = image.x + image.w + style->combo.spacing.x + style->combo.content_padding.x;
label.y = header.y + style->combo.content_padding.y;
label.h = header.h - 2 * style->combo.content_padding.y;
if (draw_button_symbol)
label.w = (button.x - style->combo.content_padding.x) - label.x;
else
label.w = (header.x + header.w - style->combo.content_padding.x) - label.x;
nk_widget_text(&win->buffer, label, selected, len, &text, NK_TEXT_LEFT, style->font);
}
return nk_combo_begin(ctx, win, size, is_clicked, header);
}